

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void closeCursorsInFrame(Vdbe *p)

{
  int iVar1;
  long lVar2;
  
  iVar1 = p->nCursor;
  if (0 < iVar1) {
    lVar2 = 0;
    do {
      if (p->apCsr[lVar2] != (VdbeCursor *)0x0) {
        sqlite3VdbeFreeCursorNN(p,p->apCsr[lVar2]);
        p->apCsr[lVar2] = (VdbeCursor *)0x0;
        iVar1 = p->nCursor;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < iVar1);
  }
  return;
}

Assistant:

static void closeCursorsInFrame(Vdbe *p){
  int i;
  for(i=0; i<p->nCursor; i++){
    VdbeCursor *pC = p->apCsr[i];
    if( pC ){
      sqlite3VdbeFreeCursorNN(p, pC);
      p->apCsr[i] = 0;
    }
  }
}